

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallFinalizableHeapBucket.cpp
# Opt level: O1

size_t __thiscall
Memory::
SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
::GetNonEmptyHeapBlockCount
          (SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
           *this,bool checkCount)

{
  SmallHeapBlockT<MediumAllocationBlockAttributes> *pSVar1;
  code *pcVar2;
  bool bVar3;
  size_t sVar4;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *pSVar5;
  undefined4 *puVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  
  lVar7 = 0;
  sVar4 = SmallNormalHeapBucketBase<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
          ::GetNonEmptyHeapBlockCount
                    (&this->
                      super_SmallNormalHeapBucketBase<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
                     ,false);
  pSVar5 = this->pendingDisposeList;
  if (pSVar5 != (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    lVar7 = 0;
    do {
      pSVar1 = (pSVar5->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
               super_SmallHeapBlockT<MediumAllocationBlockAttributes>.next;
      if (pSVar1 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
        pSVar5 = (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
      }
      else {
        pSVar5 = HeapBlock::AsFinalizableBlock<MediumAllocationBlockAttributes>
                           (&pSVar1->super_HeapBlock);
      }
      lVar7 = lVar7 + 1;
    } while (pSVar5 != (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0);
  }
  pSVar5 = this->tempPendingDisposeList;
  lVar9 = 0;
  while (pSVar5 != (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    pSVar1 = (pSVar5->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
             super_SmallHeapBlockT<MediumAllocationBlockAttributes>.next;
    if (pSVar1 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      pSVar5 = (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
    }
    else {
      pSVar5 = HeapBlock::AsFinalizableBlock<MediumAllocationBlockAttributes>
                         (&pSVar1->super_HeapBlock);
    }
    lVar9 = lVar9 + 1;
  }
  uVar8 = lVar7 + sVar4 + lVar9;
  if ((checkCount) &&
     (uVar8 != (this->
               super_SmallNormalHeapBucketBase<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
               ).
               super_HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
               .super_HeapBucket.heapBlockCount)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBucket.cpp"
                       ,0x3f,"(!checkCount || this->heapBlockCount == currentHeapBlockCount)",
                       "!checkCount || this->heapBlockCount == currentHeapBlockCount");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  return uVar8;
}

Assistant:

size_t
SmallFinalizableHeapBucketBaseT<TBlockType>::GetNonEmptyHeapBlockCount(bool checkCount) const
{
    size_t currentHeapBlockCount =  __super::GetNonEmptyHeapBlockCount(false)
        + HeapBlockList::Count(pendingDisposeList)
        + HeapBlockList::Count(tempPendingDisposeList);
    RECYCLER_SLOW_CHECK(Assert(!checkCount || this->heapBlockCount == currentHeapBlockCount));
    return currentHeapBlockCount;
}